

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable_String.h
# Opt level: O2

string * vstring_printf_abi_cxx11_(string *__return_storage_ptr__,char *format,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  va_list args_copy;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  args_copy[0].reg_save_area = args->reg_save_area;
  args_copy[0].gp_offset = args->gp_offset;
  args_copy[0].fp_offset = args->fp_offset;
  args_copy[0].overflow_arg_area = args->overflow_arg_area;
  uVar1 = vsnprintf((char *)0x0,0,format,args_copy);
  if (0 < (int)uVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (__return_storage_ptr__,(ulong)uVar1);
    iVar2 = vsnprintf((__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length + 1,format,args);
    if (iVar2 < 1) {
      __return_storage_ptr__->_M_string_length = 0;
      *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
    }
    if (__return_storage_ptr__->_M_string_length != (long)iVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (__return_storage_ptr__,(long)iVar2,0xffffffffffffffff);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string vstring_printf(const char* format, va_list args) {
	std::string result;

	// Calculate size needed for formatted string
	va_list args_copy;
	va_copy(args_copy, args);
	int min_length = std::vsnprintf(nullptr, 0, format, args_copy);
	va_end(args_copy);

	if (min_length > 0) {
		result.resize(min_length);
		min_length = vsnprintf(result.data(), result.size() + 1, format, args);
		if (min_length <= 0) {
			result.clear();
		}

		if (result.size() != min_length) {
			// This should never happen; if it does, it's probably indicative of a race condition
			result.erase(min_length);
		}
	}

	return result;
}